

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

void __thiscall
Js::JavascriptPromiseCapability::MarkVisitPtrs
          (JavascriptPromiseCapability *this,SnapshotExtractor *extractor)

{
  void **ppvVar1;
  SnapshotExtractor *extractor_local;
  JavascriptPromiseCapability *this_local;
  
  ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->promise);
  if (*ppvVar1 != (void *)0x0) {
    ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->resolve);
    if (*ppvVar1 != (void *)0x0) {
      ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->reject);
      if (*ppvVar1 != (void *)0x0) {
        ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__
                            ((WriteBarrierPtr *)&this->promise);
        TTD::SnapshotExtractor::MarkVisitVar(extractor,*ppvVar1);
        ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__
                            ((WriteBarrierPtr *)&this->resolve);
        TTD::SnapshotExtractor::MarkVisitVar(extractor,*ppvVar1);
        ppvVar1 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)&this->reject)
        ;
        TTD::SnapshotExtractor::MarkVisitVar(extractor,*ppvVar1);
        return;
      }
    }
  }
  TTDAbort_unrecoverable_error("Seems odd, I was not expecting this!!!");
}

Assistant:

void JavascriptPromiseCapability::MarkVisitPtrs(TTD::SnapshotExtractor* extractor)
    {
        TTDAssert(this->promise != nullptr && this->resolve != nullptr && this->reject != nullptr, "Seems odd, I was not expecting this!!!");

        extractor->MarkVisitVar(this->promise);

        extractor->MarkVisitVar(this->resolve);
        extractor->MarkVisitVar(this->reject);
    }